

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

string * __thiscall
Shell::resultToString_abi_cxx11_(string *__return_storage_ptr__,Shell *this,ActionResult *result)

{
  char *__s;
  undefined1 local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [376];
  SmallVector<wasm::Literal,_1UL> local_50;
  
  switch((result->
         super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         ).
         super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         .
         super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
         ._M_index) {
  case '\0':
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_50,(SmallVector<wasm::Literal,_1UL> *)result);
    wasm::operator<<(local_1c8,(Literals)_local_1d8);
    wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_50);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
    return __return_storage_ptr__;
  case '\x01':
    __s = "trap";
    break;
  case '\x02':
    __s = "exceeded host limit";
    break;
  case '\x03':
    __s = "exception";
    break;
  default:
    wasm::handle_unreachable
              ("unexpected result",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
               ,0xcc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string resultToString(ActionResult& result) {
    if (std::get_if<TrapResult>(&result)) {
      return "trap";
    } else if (std::get_if<HostLimitResult>(&result)) {
      return "exceeded host limit";
    } else if (std::get_if<ExceptionResult>(&result)) {
      return "exception";
    } else if (auto* vals = std::get_if<Literals>(&result)) {
      std::stringstream ss;
      ss << *vals;
      return ss.str();
    } else {
      WASM_UNREACHABLE("unexpected result");
    }
  }